

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::localeIdName
          (LocaleDisplayNamesImpl *this,char *localeId,UnicodeString *result)

{
  UBool UVar1;
  UnicodeString *pUVar2;
  UnicodeString *result_local;
  char *localeId_local;
  LocaleDisplayNamesImpl *this_local;
  
  if (this->nameLength == UDISPCTX_LENGTH_SHORT) {
    ICUDataTable::getNoFallback(&this->langData,"Languages%short",localeId,result);
    UVar1 = UnicodeString::isBogus(result);
    if (UVar1 == '\0') {
      return result;
    }
  }
  pUVar2 = ICUDataTable::getNoFallback(&this->langData,"Languages",localeId,result);
  return pUVar2;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::localeIdName(const char* localeId,
                                     UnicodeString& result) const {
    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        langData.getNoFallback("Languages%short", localeId, result);
        if (!result.isBogus()) {
            return result;
        }
    }
    return langData.getNoFallback("Languages", localeId, result);
}